

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O2

bool spvtools::opt::(anonymous_namespace)::AnyTypeOf<bool(*)(spvtools::opt::Instruction_const*)>
               (Instruction *instruction,_func_bool_Instruction_ptr *predicate)

{
  bool bVar1;
  bool bVar2;
  uint32_t uVar3;
  DefUseManager *this;
  _Elt_pointer puVar4;
  Instruction *instruction_00;
  ulong uVar5;
  bool bVar6;
  _Any_data local_a0;
  code *local_90;
  code *local_88;
  stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
  instructions_to_visit;
  
  bVar1 = IsTypeInst(instruction->opcode_);
  if (!bVar1) {
    __assert_fail("IsTypeInst(instruction->opcode()) && \"AnyTypeOf called with a non-type instruction.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/trim_capabilities_pass.cpp"
                  ,0x69,
                  "bool spvtools::opt::(anonymous namespace)::AnyTypeOf(const Instruction *, UnaryPredicate) [UnaryPredicate = bool (*)(const spvtools::opt::Instruction *)]"
                 );
  }
  std::stack<unsigned_int,std::deque<unsigned_int,std::allocator<unsigned_int>>>::
  stack<std::deque<unsigned_int,std::allocator<unsigned_int>>,void>(&instructions_to_visit);
  local_a0._0_4_ = Instruction::result_id(instruction);
  std::deque<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&instructions_to_visit.c,(uint *)local_a0._M_pod_data);
  this = IRContext::get_def_use_mgr(instruction->context_);
  bVar1 = false;
LAB_00467f16:
  do {
    while( true ) {
      do {
        bVar6 = bVar1;
        if (instructions_to_visit.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur ==
            instructions_to_visit.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur) {
          std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base
                    ((_Deque_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &instructions_to_visit);
          return bVar6;
        }
        puVar4 = instructions_to_visit.c.
                 super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_cur;
        if (instructions_to_visit.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur ==
            instructions_to_visit.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_first) {
          puVar4 = instructions_to_visit.c.
                   super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
        }
        instruction_00 = analysis::DefUseManager::GetDef(this,puVar4[-1]);
        std::deque<unsigned_int,_std::allocator<unsigned_int>_>::pop_back(&instructions_to_visit.c);
        bVar1 = true;
      } while (((bVar6) || (bVar2 = anon_unknown_0::is16bitType(instruction_00), bVar2)) ||
              (uVar5 = (ulong)instruction_00->opcode_, bVar1 = bVar6, 0x20 < uVar5));
      if ((0x31800000UL >> (uVar5 & 0x3f) & 1) == 0) break;
      uVar3 = 0;
LAB_00467f84:
      uVar3 = Instruction::GetSingleWordInOperand(instruction_00,uVar3);
      local_a0._0_4_ = uVar3;
      std::deque<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&instructions_to_visit.c,(uint *)local_a0._M_pod_data);
    }
    if (uVar5 != 0x1e) {
      if (uVar5 == 0x20) {
        uVar3 = 1;
        goto LAB_00467f84;
      }
      goto LAB_00467f16;
    }
    local_a0._8_8_ = 0;
    local_88 = std::
               _Function_handler<void_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/trim_capabilities_pass.cpp:91:30)>
               ::_M_invoke;
    local_90 = std::
               _Function_handler<void_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/trim_capabilities_pass.cpp:91:30)>
               ::_M_manager;
    local_a0._M_unused._0_8_ = (undefined8)&instructions_to_visit;
    Instruction::ForEachInOperand(instruction_00,(function<void_(const_unsigned_int_*)> *)&local_a0)
    ;
    if (local_90 != (code *)0x0) {
      (*local_90)(&local_a0,&local_a0,__destroy_functor);
    }
  } while( true );
}

Assistant:

static bool AnyTypeOf(const Instruction* instruction,
                      UnaryPredicate predicate) {
  assert(IsTypeInst(instruction->opcode()) &&
         "AnyTypeOf called with a non-type instruction.");

  bool found_one = false;
  DFSWhile(instruction, [&found_one, predicate](const Instruction* node) {
    if (found_one || predicate(node)) {
      found_one = true;
      return false;
    }

    return true;
  });
  return found_one;
}